

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_31(QPDF *pdf,char *arg2)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  allocator<char> local_6a1;
  string local_6a0 [39];
  allocator<char> local_679;
  string local_678 [32];
  QPDFObjectHandle local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  allocator<char> local_621;
  string local_620 [39];
  allocator<char> local_5f9;
  string local_5f8 [32];
  QPDFObjectHandle local_5d8;
  allocator<char> local_5c1;
  string local_5c0 [39];
  allocator<char> local_599;
  string local_598 [32];
  QPDFObjectHandle local_578;
  QPDFObjectHandle local_568;
  allocator<char> local_551;
  string local_550 [39];
  allocator<char> local_529;
  string local_528 [32];
  QPDFObjectHandle local_508;
  QPDFObjectHandle local_4f8;
  allocator<char> local_4e1;
  string local_4e0 [39];
  allocator<char> local_4b9;
  string local_4b8 [32];
  QPDFObjectHandle local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  allocator<char> local_461;
  string local_460 [39];
  allocator<char> local_439;
  string local_438 [32];
  QPDFObjectHandle local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [32];
  QPDFObjectHandle local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [32];
  QPDFObjectHandle local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [32];
  QPDFObjectHandle local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  QPDFObjectHandle local_218;
  QPDFObjectHandle local_208;
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [32];
  QPDFObjectHandle local_1a8;
  QPDFObjectHandle local_198;
  runtime_error *e_1;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [32];
  QPDFObjectHandle local_130;
  logic_error *e;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  QPDFObjectHandle local_c8;
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  QPDFObjectHandle o2;
  string local_48 [32];
  undefined1 local_28 [8];
  QPDFObjectHandle o1;
  char *arg2_local;
  QPDF *pdf_local;
  
  o1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  operator____qpdf(local_28,0x172491);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar3 = std::operator<<((ostream *)&std::cout,local_48);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"   12345 \f  ",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"",&local_b1);
  QPDFObjectHandle::parse((string *)local_68,local_88);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  bVar1 = QPDFObjectHandle::isInteger();
  bVar2 = false;
  if ((bVar1 & 1) != 0) {
    lVar4 = QPDFObjectHandle::getIntValue();
    bVar2 = lVar4 == 0x3039;
  }
  if (!bVar2) {
    __assert_fail("o2.isInteger() && (o2.getIntValue() == 12345)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x499,"void test_31(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"[1 0 R]",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"indirect test",(allocator<char> *)((long)&e + 7));
  QPDFObjectHandle::parse((string *)&local_c8,local_e8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  poVar3 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"0 trailing",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"trailing test",(allocator<char> *)((long)&e_1 + 7));
  QPDFObjectHandle::parse((string *)&local_130,local_150);
  QPDFObjectHandle::~QPDFObjectHandle(&local_130);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  poVar3 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"[5 0 R]",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"",&local_1f1);
  QPDFObjectHandle::parse((QPDF *)&local_1a8,(string *)pdf,local_1c8);
  QPDFObjectHandle::getArrayItem((int)&local_198);
  bVar1 = QPDFObjectHandle::isInteger();
  if ((bVar1 & 1) == 0) {
    __assert_fail("QPDFObjectHandle::parse(&pdf, \"[5 0 R]\").getArrayItem(0).isInteger()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x4a6,"void test_31(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_198);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"[5 0 R]",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_260,"",&local_261);
  QPDFObjectHandle::parse((QPDF *)&local_218,(string *)pdf,local_238);
  QPDFObjectHandle::getArrayItem((int)&local_208);
  bVar1 = QPDFObjectHandle::isDirectNull();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!QPDFObjectHandle::parse(&pdf, \"[5 0 R]\").getArrayItem(0).isDirectNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x4a7,"void test_31(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_208);
  QPDFObjectHandle::~QPDFObjectHandle(&local_218);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"[5 0 R 0 R /X]",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"",&local_2e1);
  QPDFObjectHandle::parse((QPDF *)&local_298,(string *)pdf,local_2b8);
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar2 = std::operator==(&local_288,"[ 5 0 R 0 (R) /X ]");
  if (!bVar2) {
    __assert_fail("QPDFObjectHandle::parse(&pdf, \"[5 0 R 0 R /X]\").unparse() == \"[ 5 0 R 0 (R) /X ]\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x4aa,"void test_31(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_288);
  QPDFObjectHandle::~QPDFObjectHandle(&local_298);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"[1 0 R]",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_360,"indirect test",&local_361);
  QPDFObjectHandle::parse((QPDF *)&local_318,(string *)pdf,local_338);
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar2 = std::operator==(&local_308,"[ 1 0 R ]");
  if (!bVar2) {
    __assert_fail("QPDFObjectHandle::parse(&pdf, \"[1 0 R]\", \"indirect test\").unparse() == \"[ 1 0 R ]\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x4ab,"void test_31(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_308);
  QPDFObjectHandle::~QPDFObjectHandle(&local_318);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"}",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"",&local_3e1);
  QPDFObjectHandle::parse((QPDF *)&local_398,(string *)pdf,local_3b8);
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar2 = std::operator==(&local_388,"null");
  if (!bVar2) {
    __assert_fail("QPDFObjectHandle::parse(&pdf, \"}\").unparse() == \"null\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x4ad,"void test_31(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_388);
  QPDFObjectHandle::~QPDFObjectHandle(&local_398);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"{",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"",&local_461);
  QPDFObjectHandle::parse((QPDF *)&local_418,(string *)pdf,local_438);
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar2 = std::operator==(&local_408,"null");
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_408);
    QPDFObjectHandle::~QPDFObjectHandle(&local_418);
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator(&local_461);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator(&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4b8,">>",&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4e0,"",&local_4e1);
    QPDFObjectHandle::parse((QPDF *)&local_498,(string *)pdf,local_4b8);
    QPDFObjectHandle::unparse_abi_cxx11_();
    bVar2 = std::operator==(&local_488,"null");
    if (!bVar2) {
      __assert_fail("QPDFObjectHandle::parse(&pdf, \">>\").unparse() == \"null\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x4b0,"void test_31(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_488);
    QPDFObjectHandle::~QPDFObjectHandle(&local_498);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_528,"[7 0 R]",&local_529);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_550,"",&local_551);
    QPDFObjectHandle::parse((QPDF *)&local_508,(string *)pdf,local_528);
    QPDFObjectHandle::getArrayItem((int)&local_4f8);
    bVar1 = QPDFObjectHandle::isNull();
    if ((bVar1 & 1) == 0) {
      __assert_fail("QPDFObjectHandle::parse(&pdf, \"[7 0 R]\").getArrayItem(0).isNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x4b2,"void test_31(QPDF &, const char *)");
    }
    QPDFObjectHandle::~QPDFObjectHandle(&local_4f8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_508);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator(&local_551);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator(&local_529);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_598,"[7 0 R]",&local_599);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_5c0,"",&local_5c1);
    QPDFObjectHandle::parse((QPDF *)&local_578,(string *)pdf,local_598);
    QPDFObjectHandle::getArrayItem((int)&local_568);
    bVar1 = QPDFObjectHandle::isDirectNull();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      __assert_fail("!QPDFObjectHandle::parse(&pdf, \"[7 0 R]\").getArrayItem(0).isDirectNull()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x4b3,"void test_31(QPDF &, const char *)");
    }
    QPDFObjectHandle::~QPDFObjectHandle(&local_568);
    QPDFObjectHandle::~QPDFObjectHandle(&local_578);
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
    std::__cxx11::string::~string(local_598);
    std::allocator<char>::~allocator(&local_599);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_5f8,"null",&local_5f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_620,"",&local_621);
    QPDFObjectHandle::parse((QPDF *)&local_5d8,(string *)pdf,local_5f8);
    bVar1 = QPDFObjectHandle::isDirectNull();
    if ((bVar1 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_5d8);
      std::__cxx11::string::~string(local_620);
      std::allocator<char>::~allocator(&local_621);
      std::__cxx11::string::~string(local_5f8);
      std::allocator<char>::~allocator(&local_5f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_678,"[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]",&local_679);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_6a0,"",&local_6a1);
      QPDFObjectHandle::parse((QPDF *)&local_658,(string *)pdf,local_678);
      QPDFObjectHandle::unparse_abi_cxx11_();
      bVar2 = std::operator==(&local_648,"[ null null null null null ]");
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_648);
        QPDFObjectHandle::~QPDFObjectHandle(&local_658);
        std::__cxx11::string::~string(local_6a0);
        std::allocator<char>::~allocator(&local_6a1);
        std::__cxx11::string::~string(local_678);
        std::allocator<char>::~allocator(&local_679);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
        return;
      }
      __assert_fail("QPDFObjectHandle::parse(&pdf, \"[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]\").unparse() == \"[ null null null null null ]\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x4b8,"void test_31(QPDF &, const char *)");
    }
    __assert_fail("QPDFObjectHandle::parse(&pdf, \"null\").isDirectNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x4b4,"void test_31(QPDF &, const char *)");
  }
  __assert_fail("QPDFObjectHandle::parse(&pdf, \"{\").unparse() == \"null\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x4ae,"void test_31(QPDF &, const char *)");
}

Assistant:

static void
test_31(QPDF& pdf, char const* arg2)
{
    auto o1 = "[/name 16059 3.14159 false\n"
              " << /key true /other [ (string1) (string2) ] >> null]"_qpdf;
    std::cout << o1.unparse() << std::endl;
    QPDFObjectHandle o2 = QPDFObjectHandle::parse("   12345 \f  ");
    assert(o2.isInteger() && (o2.getIntValue() == 12345));
    try {
        QPDFObjectHandle::parse("[1 0 R]", "indirect test");
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error parsing indirect: " << e.what() << std::endl;
    }
    try {
        QPDFObjectHandle::parse("0 trailing", "trailing test");
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::runtime_error const& e) {
        std::cout << "trailing data: " << e.what() << std::endl;
    }
    assert(QPDFObjectHandle::parse(&pdf, "[5 0 R]").getArrayItem(0).isInteger());
    assert(!QPDFObjectHandle::parse(&pdf, "[5 0 R]").getArrayItem(0).isDirectNull());
    // Make sure an indirect integer followed by "0 R" is not
    // mistakenly parsed as an indirect object.
    assert(QPDFObjectHandle::parse(&pdf, "[5 0 R 0 R /X]").unparse() == "[ 5 0 R 0 (R) /X ]");
    assert(QPDFObjectHandle::parse(&pdf, "[1 0 R]", "indirect test").unparse() == "[ 1 0 R ]");
    // TC:QPDFParser bad brace
    assert(QPDFObjectHandle::parse(&pdf, "}").unparse() == "null");
    assert(QPDFObjectHandle::parse(&pdf, "{").unparse() == "null");
    // TC:QPDFParser bad dictionary close
    assert(QPDFObjectHandle::parse(&pdf, ">>").unparse() == "null");
    // TC:QPDFParser eof in parse
    assert(QPDFObjectHandle::parse(&pdf, "[7 0 R]").getArrayItem(0).isNull());
    assert(!QPDFObjectHandle::parse(&pdf, "[7 0 R]").getArrayItem(0).isDirectNull());
    assert(QPDFObjectHandle::parse(&pdf, "null").isDirectNull());
    // TC:QPDFParser invalid objgen
    assert(
        QPDFObjectHandle::parse(&pdf, "[0 0 R -1 0 R 1 65535 R 1 100000 R 1 -1 R]").unparse() ==
        "[ null null null null null ]");
}